

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void test<linq::IEnumerable<int>>(IEnumerable<int> *source)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source_00;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  vector<int,_std::allocator<int>_> *source_05;
  vector<int,_std::allocator<int>_> *source_06;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  allocator_type local_109;
  _Vector_base<int,_std::allocator<int>_> local_108;
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_> local_f0;
  IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
  local_c0;
  int local_38 [8];
  
  iVar2 = linq::IEnumerable<int>::Min(source);
  assertEquals<int,int>(3,iVar2);
  iVar2 = linq::IEnumerable<int>::Max(source);
  assertEquals<int,int>(10,iVar2);
  sVar3 = linq::IEnumerable<int>::Count(source);
  assertEquals<int,unsigned_long>(8,sVar3);
  iVar2 = linq::IEnumerable<int>::Sum(source);
  assertEquals<int,int>(0x34,iVar2);
  linq::IEnumerable<int>::Take
            ((IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *)&local_c0,source,3);
  iVar2 = linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_>::Min
                    ((IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *)&local_c0);
  assertEquals<int,int>(3,iVar2);
  linq::TakeState<linq::IEnumerable<int>,_int>::~TakeState
            ((TakeState<linq::IEnumerable<int>,_int> *)&local_c0);
  linq::IEnumerable<int>::Take
            ((IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *)&local_c0,source,3);
  iVar2 = linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_>::Max
                    ((IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *)&local_c0);
  assertEquals<int,int>(5,iVar2);
  linq::TakeState<linq::IEnumerable<int>,_int>::~TakeState
            ((TakeState<linq::IEnumerable<int>,_int> *)&local_c0);
  linq::IEnumerable<int>::Skip
            ((IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *)&local_c0,source,3);
  iVar2 = linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_>::Min
                    ((IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *)&local_c0);
  assertEquals<int,int>(6,iVar2);
  linq::SkipState<linq::IEnumerable<int>,_int>::~SkipState
            ((SkipState<linq::IEnumerable<int>,_int> *)&local_c0);
  linq::IEnumerable<int>::Skip
            ((IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *)&local_c0,source,3);
  iVar2 = linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_>::Max
                    ((IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *)&local_c0);
  assertEquals<int,int>(10,iVar2);
  linq::SkipState<linq::IEnumerable<int>,_int>::~SkipState
            ((SkipState<linq::IEnumerable<int>,_int> *)&local_c0);
  linq::IEnumerable<int>::
  TakeWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_1_>
            ((IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001_for_filter *)&local_f0);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
          ::Min((IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
                 *)&local_c0);
  assertEquals<int,int>(3,iVar2);
  linq::
  TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>
  ::~TakeWhileState((TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>
                     *)&local_c0);
  linq::IEnumerable<int>::
  TakeWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_2_>
            ((IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001_for_filter *)&local_f0);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
          ::Max((IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
                 *)&local_c0);
  assertEquals<int,int>(4,iVar2);
  linq::
  TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>
  ::~TakeWhileState((TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>
                     *)&local_c0);
  linq::IEnumerable<int>::
  SkipWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_3_>
            ((IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001_for_filter *)&local_f0);
  iVar2 = linq::
          IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
          ::Min((IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
                 *)&local_c0);
  assertEquals<int,int>(5,iVar2);
  linq::
  SkipWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>
  ::~SkipWhileState((SkipWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>
                     *)&local_c0);
  linq::IEnumerable<int>::
  Where<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_4_>
            ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001_for_filter *)&local_f0);
  sVar3 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
          ::Count((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(4,sVar3);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>
  ::~WhereState((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>
                 *)&local_c0);
  linq::IEnumerable<int>::
  Where<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_5_>
            ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
              *)&local_f0,source,(anon_class_1_0_00000001_for_filter *)&local_108);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::Skip((IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>_>
          *)&local_c0,
         (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
          *)&local_f0,1);
  iVar2 = linq::
          First<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_5_,int>,int>>
                    ((SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>
                      *)&local_c0);
  assertEquals<int,int>(6,iVar2);
  linq::
  SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>
  ::~SkipState((SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>
                *)&local_c0);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>
  ::~WhereState((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>
                 *)&local_f0);
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_6_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001 *)&local_f0);
  sVar3 = linq::
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
          ::Count((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
            ((GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *)&local_c0);
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_7_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001 *)&local_108);
  linq::First<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
            ((OUT *)&local_f0,(linq *)&local_c0,source_00);
  sVar3 = linq::IEnumerable<int_&>::Count((IEnumerable<int_&> *)&local_f0);
  assertEquals<int,unsigned_long>(6,sVar3);
  linq::IEnumerable<int_&>::~IEnumerable((IEnumerable<int_&> *)&local_f0);
  linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
            ((GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *)&local_c0);
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_8_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
              *)&local_c0,source,(anon_class_1_0_00000001 *)&local_108);
  linq::Last<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
            ((OUT *)&local_f0,(linq *)&local_c0,source_01);
  sVar3 = linq::IEnumerable<int_&>::Count((IEnumerable<int_&> *)&local_f0);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::IEnumerable<int_&>::~IEnumerable((IEnumerable<int_&> *)&local_f0);
  linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
            ((GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *)&local_c0);
  iVar2 = linq::IEnumerable<int>::
          Single<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_9_>
                    (source,(anon_class_1_0_00000001_for_filter *)&local_c0);
  assertEquals<int,int>(5,iVar2);
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 6;
  local_38[3] = 7;
  local_38[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l,&local_109);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0,(linq *)&local_108,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)&local_c0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_f0,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Min((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                 *)&local_c0);
  assertEquals<int,int>(5,iVar2);
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::~IntersectState((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                     *)&local_c0);
  linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 6;
  local_38[3] = 7;
  local_38[4] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l_00,&local_109);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0,(linq *)&local_108,source_03);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)&local_c0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_f0,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Max((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                 *)&local_c0);
  assertEquals<int,int>(7,iVar2);
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::~IntersectState((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                     *)&local_c0);
  linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 6;
  local_38[3] = 7;
  local_38[4] = 5;
  __l_01._M_len = 5;
  __l_01._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l_01,&local_109);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0,(linq *)&local_108,source_04);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)&local_c0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_f0,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::~IntersectState((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                     *)&local_c0);
  linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 6;
  local_38[3] = 7;
  local_38[4] = 5;
  __l_02._M_len = 5;
  __l_02._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l_02,&local_109);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0,(linq *)&local_108,source_05);
  linq::IEnumerable<int>::
  Intersect<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            ((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)&local_c0,source,
             (IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::~IntersectState(&local_c0);
  linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 6;
  local_38[3] = 7;
  local_38[4] = 5;
  __l_03._M_len = 5;
  __l_03._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l_03,&local_109);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0,(linq *)&local_108,source_06);
  linq::IEnumerable<int>::
  Except<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            ((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)&local_c0,source,
             (IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_f0);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(5,sVar3);
  linq::
  ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::~ExceptState((ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
                  *)&local_c0);
  linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  linq::IEnumerable<int>::Range((IEnumerable<int> *)&local_f0,5,9);
  linq::IEnumerable<int>::Except<linq::IEnumerable<int>>
            ((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)&local_c0,source,(IEnumerable<int> *)&local_f0);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::~ExceptState((ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
                  *)&local_c0);
  linq::IEnumerable<int>::~IEnumerable((IEnumerable<int> *)&local_f0);
  linq::IEnumerable<int>::Intersect<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)&local_c0,source,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(8,sVar3);
  linq::
  IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::~IntersectState((IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                     *)&local_c0);
  linq::IEnumerable<int>::Except<linq::IEnumerable<int>&>
            ((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)&local_c0,source,source);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)&local_c0);
  assertEquals<int,unsigned_long>(0,sVar3);
  linq::
  ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::~ExceptState((ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
                  *)&local_c0);
  bVar1 = linq::Any<linq::IEnumerable<int>>(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::IEnumerable<int>::
          Any<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_10_>
                    (source,(anon_class_1_0_00000001_for_filter *)&local_c0);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          All<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_11_>
                    (source,(anon_class_1_0_00000001 *)&local_c0);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::IEnumerable<int>::
          Any<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_12_>
                    (source,(anon_class_1_0_00000001_for_filter *)&local_c0);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::
          All<linq::IEnumerable<int>,test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_13_>
                    (source,(anon_class_1_0_00000001 *)&local_c0);
  assertEquals<bool,bool>(true,bVar1);
  local_c0.super_IState<int>._vptr_IState._0_4_ = 6;
  bVar1 = linq::Contains<linq::IEnumerable<int>,int>(source,(int *)&local_c0);
  assertEquals<bool,bool>(true,bVar1);
  local_c0.super_IState<int>._vptr_IState._0_4_ = 0x10;
  bVar1 = linq::Contains<linq::IEnumerable<int>,int>(source,(int *)&local_c0);
  assertEquals<bool,bool>(false,bVar1);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}